

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderRequire(Fts3SegReader *pReader,char *pFrom,int nByte)

{
  bool bVar1;
  int local_20;
  int rc;
  int nByte_local;
  char *pFrom_local;
  Fts3SegReader *pReader_local;
  
  local_20 = 0;
  while( true ) {
    bVar1 = false;
    if ((pReader->pBlob != (sqlite3_blob *)0x0) && (bVar1 = false, local_20 == 0)) {
      bVar1 = (long)pReader->nPopulate < (long)(pFrom + ((long)nByte - (long)pReader->aNode));
    }
    if (!bVar1) break;
    local_20 = fts3SegReaderIncrRead(pReader);
  }
  return local_20;
}

Assistant:

static int fts3SegReaderRequire(Fts3SegReader *pReader, char *pFrom, int nByte){
  int rc = SQLITE_OK;
  assert( !pReader->pBlob 
       || (pFrom>=pReader->aNode && pFrom<&pReader->aNode[pReader->nNode])
  );
  while( pReader->pBlob && rc==SQLITE_OK 
     &&  (pFrom - pReader->aNode + nByte)>pReader->nPopulate
  ){
    rc = fts3SegReaderIncrRead(pReader);
  }
  return rc;
}